

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

double Js::Math::HypotHelper(Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  uint idxArg;
  bool bVar5;
  bool bVar6;
  double value;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_70;
  double local_50;
  
  bVar6 = ((ulong)args->Info & 0xfffffe) == 0;
  bVar5 = !bVar6;
  if (bVar6) {
    bVar6 = false;
    dVar8 = 0.0;
    dVar7 = 0.0;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_70 = NAN;
    local_50 = INFINITY;
    idxArg = 1;
    bVar6 = false;
    dVar7 = 0.0;
    dVar8 = 0.0;
    do {
      aValue = Arguments::operator[](args,idxArg);
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        value = (double)(int)aValue;
      }
      else if ((ulong)aValue >> 0x32 == 0) {
        value = JavascriptConversion::ToNumber_Full(aValue,scriptContext);
      }
      else {
        value = (double)((ulong)aValue ^ 0xfffc000000000000);
      }
      bVar2 = NumberUtilities::IsSpecial(value,0x7ff0000000000000);
      if ((bVar2) || (bVar2 = NumberUtilities::IsSpecial(value,0xfff0000000000000), bVar2)) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (!bVar6) {
          bVar3 = NumberUtilities::IsNan(value);
          bVar2 = true;
          if (bVar3) {
            bVar6 = true;
          }
          else {
            bVar3 = NumberUtilities::IsNan(value);
            dVar9 = local_70;
            if (!bVar3) {
              dVar9 = ABS(value);
            }
            if (dVar9 <= dVar8) {
              if ((dVar8 != 0.0) || (NAN(dVar8))) {
                dVar7 = dVar7 + (dVar9 / dVar8) * (dVar9 / dVar8);
              }
            }
            else {
              dVar7 = dVar7 * (dVar8 / dVar9) * (dVar8 / dVar9) + 1.0;
              dVar8 = dVar9;
              bVar2 = true;
            }
          }
        }
      }
      if (!bVar2) break;
      idxArg = idxArg + 1;
      bVar5 = idxArg < (*(uint *)&args->Info & 0xffffff);
    } while (bVar5);
  }
  if (!bVar5) {
    if (bVar6) {
      local_50 = NAN;
    }
    else {
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      local_50 = dVar8 * dVar7;
    }
  }
  return local_50;
}

Assistant:

double Math::HypotHelper(Arguments args, ScriptContext *scriptContext)
    {
        // CRT does not have a multiple version of hypot, so we implement it here ourselves.
        bool foundNaN = false;
        double scale = 0;
        double sum = 0;

        //Ignore first argument which is this pointer
        for (uint counter = 1; counter < args.Info.Count; counter++)
        {
            double doubleVal = JavascriptConversion::ToNumber(args[counter], scriptContext);

            if (JavascriptNumber::IsPosInf(doubleVal) || JavascriptNumber::IsNegInf(doubleVal))
            {
                return JavascriptNumber::POSITIVE_INFINITY;
            }

            if (!foundNaN)
            {
                if (JavascriptNumber::IsNan(doubleVal))
                {
                    //Even though we found NaN, we still need to validate none of the other arguments are +Infinity or -Infinity
                    foundNaN = true;
                }
                else
                {
                    doubleVal = Math::Abs(doubleVal);
                    if (scale < doubleVal)
                    {
                        sum = sum * (scale / doubleVal) * (scale / doubleVal) + 1; /* scale/scale === 1*/
                        //change the scale to new max value
                        scale = doubleVal;
                    }
                    else if (scale != 0)
                    {
                        sum += (doubleVal / scale) * (doubleVal / scale);
                    }
                }
            }
        }

        if (foundNaN)
        {
            return JavascriptNumber::NaN;
        }

        return scale * ::sqrt(sum);
    }